

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

wchar_t mtree_entry_create_virtual_dir
                  (archive_write *a,char *pathname,mtree_entry_conflict **m_entry)

{
  mtree_entry_conflict *entry_00;
  wchar_t wVar1;
  time_t t;
  mtree_entry_conflict *pmStack_38;
  wchar_t r;
  mtree_entry_conflict *file;
  archive_entry *entry;
  mtree_entry_conflict **m_entry_local;
  char *pathname_local;
  archive_write *a_local;
  
  entry = (archive_entry *)m_entry;
  m_entry_local = (mtree_entry_conflict **)pathname;
  pathname_local = (char *)a;
  file = (mtree_entry_conflict *)archive_entry_new();
  if ((archive_entry *)file == (archive_entry *)0x0) {
    entry->archive = (archive *)0x0;
    archive_set_error((archive *)pathname_local,0xc,"Can\'t allocate memory");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    archive_entry_copy_pathname((archive_entry *)file,(char *)m_entry_local);
    archive_entry_set_mode((archive_entry *)file,0x41ed);
    entry_00 = file;
    t = time((time_t *)0x0);
    archive_entry_set_mtime((archive_entry *)entry_00,t,0);
    wVar1 = mtree_entry_new((archive_write *)pathname_local,(archive_entry *)file,
                            &stack0xffffffffffffffc8);
    archive_entry_free((archive_entry *)file);
    if (wVar1 < L'\xffffffec') {
      entry->archive = (archive *)0x0;
      archive_set_error((archive *)pathname_local,0xc,"Can\'t allocate memory");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      pmStack_38->dir_info->virtual = L'\x01';
      entry->archive = (archive *)pmStack_38;
      a_local._4_4_ = L'\0';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
mtree_entry_create_virtual_dir(struct archive_write *a, const char *pathname,
    struct mtree_entry **m_entry)
{
	struct archive_entry *entry;
	struct mtree_entry *file;
	int r;

	entry = archive_entry_new();
	if (entry == NULL) {
		*m_entry = NULL;
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	archive_entry_copy_pathname(entry, pathname);
	archive_entry_set_mode(entry, AE_IFDIR | 0755);
	archive_entry_set_mtime(entry, time(NULL), 0);

	r = mtree_entry_new(a, entry, &file);
	archive_entry_free(entry);
	if (r < ARCHIVE_WARN) {
		*m_entry = NULL;
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}

	file->dir_info->virtual = 1;

	*m_entry = file;
	return (ARCHIVE_OK);
}